

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void unixDlError(sqlite3_vfs *NotUsed,int nBuf,char *zBufOut)

{
  long lVar1;
  char *in_RDX;
  uint in_ESI;
  char *zErr;
  
  unixEnterMutex();
  lVar1 = dlerror();
  if (lVar1 != 0) {
    sqlite3_snprintf((int)(ulong)in_ESI,in_RDX,"%s",lVar1);
  }
  unixLeaveMutex();
  return;
}

Assistant:

static void unixDlError(sqlite3_vfs *NotUsed, int nBuf, char *zBufOut){
  const char *zErr;
  UNUSED_PARAMETER(NotUsed);
  unixEnterMutex();
  zErr = dlerror();
  if( zErr ){
    sqlite3_snprintf(nBuf, zBufOut, "%s", zErr);
  }
  unixLeaveMutex();
}